

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::del_edge_features(task_data *param_1,uint32_t n,multi_ex *ec)

{
  uchar **ppuVar1;
  size_t *psVar2;
  example *peVar3;
  
  ppuVar1 = &((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start[n]->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  peVar3 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[n];
  peVar3->total_sum_feat_sq =
       peVar3->total_sum_feat_sq -
       *(float *)((long)((peVar3->super_example_predict).feature_space + 0x83) + 0x60);
  psVar2 = &(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start[n]->num_features;
  *psVar2 = *psVar2 - ((long)*(float **)
                              ((long)((peVar3->super_example_predict).feature_space + 0x83) + 8) -
                       (long)(peVar3->super_example_predict).feature_space[0x83].values._begin >> 2)
  ;
  features::clear((peVar3->super_example_predict).feature_space + 0x83);
  return;
}

Assistant:

void del_edge_features(task_data& /*D*/, uint32_t n, multi_ex& ec)
{
  ec[n]->indices.pop();
  features& fs = ec[n]->feature_space[neighbor_namespace];
  ec[n]->total_sum_feat_sq -= fs.sum_feat_sq;
  ec[n]->num_features -= fs.size();
  fs.clear();
}